

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

bool __thiscall absl::Mutex::ReaderLockWhenWithDeadline(Mutex *this,Condition *cond,Time deadline)

{
  bool bVar1;
  GraphId id;
  int64_t iVar2;
  SynchLocksHeld *held_locks;
  KernelTimeout t;
  undefined8 extraout_RDX;
  int64_t iVar3;
  Time t_00;
  
  id = DebugOnlyDeadlockCheck(this);
  if ((absl *)deadline.rep_.rep_hi_ == (absl *)0x7fffffffffffffff &&
      deadline.rep_.rep_lo_ == 0xffffffff) {
    t.ns_ = 0;
  }
  else {
    t_00.rep_.rep_hi_ = (ulong)deadline.rep_.rep_lo_;
    t_00.rep_._8_8_ = extraout_RDX;
    iVar2 = ToUnixNanos((absl *)deadline.rep_.rep_hi_,t_00);
    iVar3 = 1;
    if (1 < iVar2) {
      iVar3 = iVar2;
    }
    t.ns_ = 0;
    if (iVar2 != 0x7fffffffffffffff) {
      t.ns_ = iVar3;
    }
  }
  bVar1 = LockSlowWithDeadline(this,(MuHow)kSharedS,cond,t,0);
  if (_ZN4absl12_GLOBAL__N_124synch_deadlock_detectionE_0 != 0) {
    held_locks = Synch_GetAllLocks();
    LockEnter(this,id,held_locks);
  }
  return bVar1;
}

Assistant:

bool Mutex::ReaderLockWhenWithDeadline(const Condition &cond,
                                       absl::Time deadline) {
  ABSL_TSAN_MUTEX_PRE_LOCK(this, __tsan_mutex_read_lock);
  GraphId id = DebugOnlyDeadlockCheck(this);
  bool res = LockSlowWithDeadline(kShared, &cond, KernelTimeout(deadline), 0);
  DebugOnlyLockEnter(this, id);
  ABSL_TSAN_MUTEX_POST_LOCK(this, __tsan_mutex_read_lock, 0);
  return res;
}